

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProcessor.cpp
# Opt level: O0

void __thiscall
cali::FormatProcessor::FormatProcessorImpl::create_formatter
          (FormatProcessorImpl *this,QuerySpec *spec)

{
  CaliFormatter *pCVar1;
  JsonFormatter *this_00;
  Expand *this_01;
  UserFormatter *this_02;
  TableFormatter *this_03;
  TreeFormatter *this_04;
  JsonSplitFormatter *this_05;
  QuerySpec *spec_local;
  FormatProcessorImpl *this_local;
  
  if ((spec->format).opt == Default) {
    pCVar1 = (CaliFormatter *)operator_new(0x18);
    anon_unknown.dwarf_f8f18::CaliFormatter::CaliFormatter(pCVar1,&this->m_stream);
    this->m_formatter = (Formatter *)pCVar1;
  }
  else {
    switch((spec->format).formatter.id) {
    case 0:
      pCVar1 = (CaliFormatter *)operator_new(0x18);
      anon_unknown.dwarf_f8f18::CaliFormatter::CaliFormatter(pCVar1,&this->m_stream);
      this->m_formatter = (Formatter *)pCVar1;
      break;
    case 1:
      this_00 = (JsonFormatter *)operator_new(0x18);
      JsonFormatter::JsonFormatter(this_00,&this->m_stream,spec);
      this->m_formatter = (Formatter *)this_00;
      break;
    case 2:
      this_01 = (Expand *)operator_new(0x18);
      Expand::Expand(this_01,&this->m_stream,spec);
      this->m_formatter = (Formatter *)this_01;
      break;
    case 3:
      this_02 = (UserFormatter *)operator_new(0x18);
      UserFormatter::UserFormatter(this_02,&this->m_stream,spec);
      this->m_formatter = (Formatter *)this_02;
      break;
    case 4:
      this_03 = (TableFormatter *)operator_new(0x18);
      TableFormatter::TableFormatter(this_03,spec);
      this->m_formatter = (Formatter *)this_03;
      break;
    case 5:
      this_04 = (TreeFormatter *)operator_new(0x18);
      TreeFormatter::TreeFormatter(this_04,spec);
      this->m_formatter = (Formatter *)this_04;
      break;
    case 6:
      this_05 = (JsonSplitFormatter *)operator_new(0x18);
      JsonSplitFormatter::JsonSplitFormatter(this_05,spec);
      this->m_formatter = (Formatter *)this_05;
    }
  }
  return;
}

Assistant:

void create_formatter(const QuerySpec& spec)
    {
        if (spec.format.opt == QuerySpec::FormatSpec::Default) {
            m_formatter = new CaliFormatter(m_stream);
        } else {
            switch (spec.format.formatter.id) {
            case FormatterID::Cali:
                m_formatter = new CaliFormatter(m_stream);
                break;
            case FormatterID::Json:
                m_formatter = new JsonFormatter(m_stream, spec);
                break;
            case FormatterID::Expand:
                m_formatter = new Expand(m_stream, spec);
                break;
            case FormatterID::Format:
                m_formatter = new UserFormatter(m_stream, spec);
                break;
            case FormatterID::Table:
                m_formatter = new TableFormatter(spec);
                break;
            case FormatterID::Tree:
                m_formatter = new TreeFormatter(spec);
                break;
            case FormatterID::JsonSplit:
                m_formatter = new JsonSplitFormatter(spec);
                break;
            }
        }
    }